

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnnoptimize.cpp
# Opt level: O0

int __thiscall NetOptimize::fuse_innerproduct_batchnorm(NetOptimize *this)

{
  allocator_type *paVar1;
  pointer pMVar2;
  value_type pLVar3;
  undefined1 uVar4;
  undefined1 uVar5;
  undefined1 uVar6;
  undefined1 uVar7;
  undefined1 uVar8;
  undefined1 uVar9;
  undefined1 uVar10;
  FILE *__stream;
  bool bVar11;
  int iVar12;
  reference ppLVar13;
  reference pvVar14;
  size_type sVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  reference pvVar18;
  pointer *ppMVar19;
  reference pvVar20;
  int iVar21;
  long in_RDI;
  float fVar22;
  double dVar23;
  float fVar24;
  int top_blob_index_final;
  int j_1;
  float *conv_weight_outch;
  int i_3;
  float *bias;
  float *weight;
  int weight_per_outch;
  float sqrt_var;
  int i_1;
  vector<float,_std::allocator<float>_> b;
  vector<float,_std::allocator<float>_> a;
  float eps;
  int channels;
  BatchNorm *batchnorm;
  InnerProduct *innerproduct;
  size_t j;
  int top_blob_index;
  size_t i;
  size_t layer_count;
  int i_2;
  float *ptr;
  int size;
  int in_stack_fffffffffffffd08;
  int in_stack_fffffffffffffd0c;
  float in_stack_fffffffffffffd10;
  value_type in_stack_fffffffffffffd14;
  pointer in_stack_fffffffffffffd18;
  allocator_type *in_stack_fffffffffffffd20;
  undefined4 in_stack_fffffffffffffd28;
  int in_stack_fffffffffffffd2c;
  Mat *in_stack_fffffffffffffd30;
  int local_22c;
  int local_21c;
  Mat local_200;
  float local_1b4;
  int local_1b0;
  vector<float,_std::allocator<float>_> local_1a8 [2];
  vector<float,_std::allocator<float>_> local_178;
  float local_160;
  int local_15c;
  value_type local_158;
  value_type local_150;
  size_type local_148;
  value_type local_13c;
  size_type local_138;
  ulong local_130;
  Mat *local_120;
  int local_10c;
  pointer local_108;
  int local_100;
  undefined4 local_fc;
  pointer *local_f8;
  int local_f0;
  undefined4 local_ec;
  Mat *local_e8;
  pointer *local_e0;
  pointer *local_d8;
  pointer *local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  *local_c8;
  long local_c0;
  bool *local_b8;
  long local_b0;
  string *local_a8;
  long local_a0;
  bool *local_98;
  long local_90;
  bool *local_88;
  long local_80;
  pointer *local_78;
  undefined8 local_70;
  undefined8 local_68;
  int local_5c;
  Mat *local_58;
  int local_50;
  undefined4 local_4c;
  pointer *local_48;
  int local_30;
  undefined4 local_2c;
  Mat *local_28;
  void *local_20;
  pointer local_10;
  pointer *local_8;
  
  local_130 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::size
                        (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)(in_RDI + 0x58))
  ;
  local_138 = 0;
  do {
    if (local_130 <= local_138) {
      return 0;
    }
    std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
              (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)(in_RDI + 0x58),local_138)
    ;
    bVar11 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
                             (char *)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
    if (!bVar11) {
      ppLVar13 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                           (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                             (in_RDI + 0x58),local_138);
      pvVar14 = std::vector<int,_std::allocator<int>_>::operator[](&(*ppLVar13)->tops,0);
      local_13c = *pvVar14;
      local_148 = local_138;
      do {
        do {
          do {
            local_148 = local_148 + 1;
            if (local_130 <= local_148) goto LAB_0017c39a;
            std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                      (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)(in_RDI + 0x58),
                       local_148);
            bVar11 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10
                                                ),
                                     (char *)CONCAT44(in_stack_fffffffffffffd0c,
                                                      in_stack_fffffffffffffd08));
          } while (bVar11);
          ppLVar13 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                               (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                                 (in_RDI + 0x58),local_148);
          sVar15 = std::vector<int,_std::allocator<int>_>::size(&(*ppLVar13)->bottoms);
        } while (sVar15 != 1);
        ppLVar13 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                             (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                               (in_RDI + 0x58),local_148);
        pvVar14 = std::vector<int,_std::allocator<int>_>::operator[](&(*ppLVar13)->bottoms,0);
      } while (*pvVar14 != local_13c);
LAB_0017c39a:
      if (local_148 != local_130) {
        ppLVar13 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                             (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                               (in_RDI + 0x58),local_138);
        local_150 = *ppLVar13;
        ppLVar13 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                             (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                               (in_RDI + 0x58),local_148);
        __stream = _stderr;
        local_158 = *ppLVar13;
        uVar16 = std::__cxx11::string::c_str();
        uVar17 = std::__cxx11::string::c_str();
        fprintf(__stream,"fuse_innerproduct_batchnorm %s %s\n",uVar16,uVar17);
        local_15c = *(int *)&local_158[1]._vptr_Layer;
        local_160 = *(float *)((long)&local_158[1]._vptr_Layer + 4);
        std::allocator<float>::allocator((allocator<float> *)0x17c4ac);
        std::vector<float,_std::allocator<float>_>::vector
                  ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffd30,
                   CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28),
                   in_stack_fffffffffffffd20);
        std::allocator<float>::~allocator((allocator<float> *)0x17c4d8);
        std::allocator<float>::allocator((allocator<float> *)0x17c4fd);
        std::vector<float,_std::allocator<float>_>::vector
                  ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffd30,
                   CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28),
                   in_stack_fffffffffffffd20);
        std::allocator<float>::~allocator((allocator<float> *)0x17c529);
        for (local_1b0 = 0; local_1b0 < local_15c; local_1b0 = local_1b0 + 1) {
          local_78 = &local_158[1].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage;
          local_80 = (long)local_1b0;
          dVar23 = std::sqrt((double)(ulong)(uint)((float)(*local_78)[local_80] + local_160));
          local_1b4 = SUB84(dVar23,0);
          local_88 = &local_158[2].support_tensor_storage;
          local_90 = (long)local_1b0;
          fVar22 = *(float *)(*(long *)local_88 + local_90 * 4);
          local_98 = &local_158[1].one_blob_only;
          local_a0 = (long)local_1b0;
          local_a8 = &local_158[1].name;
          local_b0 = (long)local_1b0;
          fVar24 = (*(float *)(*(long *)local_98 + local_a0 * 4) *
                   *(float *)(*(long *)local_a8 + local_b0 * 4)) / local_1b4;
          pvVar18 = std::vector<float,_std::allocator<float>_>::operator[]
                              (&local_178,(long)local_1b0);
          *pvVar18 = fVar22 - fVar24;
          local_b8 = &local_158[1].one_blob_only;
          local_c0 = (long)local_1b0;
          fVar22 = *(float *)(*(long *)local_b8 + local_c0 * 4) / local_1b4;
          pvVar18 = std::vector<float,_std::allocator<float>_>::operator[]
                              (local_1a8,(long)local_1b0);
          *pvVar18 = fVar22;
        }
        if (*(int *)((long)&local_150[1]._vptr_Layer + 4) == 0) {
          *(undefined4 *)((long)&local_150[1]._vptr_Layer + 4) = 1;
          local_58 = &local_200;
          local_5c = local_15c;
          local_68 = 4;
          local_70 = 0;
          local_200.data = (void *)0x0;
          local_200.refcount = (int *)0x0;
          local_200.elemsize = 0;
          local_200.elempack = 0;
          local_200.allocator = (Allocator *)0x0;
          local_200.dims = 0;
          local_200.w = 0;
          local_200.h = 0;
          local_200.d = 0;
          local_200.c = 0;
          local_200.cstep = 0;
          ncnn::Mat::create(in_stack_fffffffffffffd30,in_stack_fffffffffffffd2c,
                            (size_t)in_stack_fffffffffffffd20,(Allocator *)in_stack_fffffffffffffd18
                           );
          pLVar3 = local_150;
          ppMVar19 = &local_150[1].bottom_shapes.
                      super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                      super__Vector_impl_data._M_finish;
          local_e8 = &local_200;
          local_e0 = ppMVar19;
          if ((Mat *)ppMVar19 != local_e8) {
            if (local_200.refcount != (int *)0x0) {
              local_ec = 1;
              LOCK();
              local_f0 = *local_200.refcount;
              *local_200.refcount = *local_200.refcount + 1;
              UNLOCK();
            }
            local_48 = ppMVar19;
            if (local_150[1].bottom_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
              pMVar2 = local_150[1].bottom_shapes.
                       super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
              local_4c = 0xffffffff;
              LOCK();
              local_50 = *(int *)&pMVar2->data;
              *(int *)&pMVar2->data = *(int *)&pMVar2->data + -1;
              UNLOCK();
              if (local_50 == 1) {
                if (local_150[1].top_shapes.
                    super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage == (pointer)0x0) {
                  local_10 = *ppMVar19;
                  if (local_10 != (pointer)0x0) {
                    free(local_10);
                  }
                }
                else {
                  pMVar2 = local_150[1].top_shapes.
                           super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage;
                  (**(code **)((long)pMVar2->data + 0x18))(pMVar2,*ppMVar19);
                }
              }
            }
            *ppMVar19 = (pointer)0x0;
            pLVar3[1].top_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            *(undefined4 *)
             &pLVar3[1].top_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
              .super__Vector_impl_data._M_finish = 0;
            *(undefined4 *)&pLVar3[2]._vptr_Layer = 0;
            *(undefined4 *)((long)&pLVar3[2]._vptr_Layer + 4) = 0;
            pLVar3[2].one_blob_only = false;
            pLVar3[2].support_inplace = false;
            pLVar3[2].support_vulkan = false;
            pLVar3[2].support_packing = false;
            pLVar3[2].support_bf16_storage = false;
            pLVar3[2].support_fp16_storage = false;
            pLVar3[2].support_int8_storage = false;
            pLVar3[2].support_image_storage = false;
            pLVar3[2].support_tensor_storage = false;
            pLVar3[2].support_reserved_00 = false;
            pLVar3[2].support_reserved_0 = false;
            pLVar3[2].support_reserved_1 = false;
            pLVar3[2].support_reserved_6 = false;
            pLVar3[2].support_reserved_7 = false;
            pLVar3[2].support_reserved_8 = false;
            pLVar3[2].support_reserved_9 = false;
            pLVar3[2].support_reserved_10 = false;
            pLVar3[2].support_reserved_11 = false;
            pLVar3[2].support_reserved_12 = false;
            pLVar3[2].support_reserved_13 = false;
            pLVar3[1].bottom_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            *ppMVar19 = (pointer)local_e8->data;
            pLVar3[1].bottom_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_e8->refcount;
            pLVar3[1].top_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)local_e8->elemsize;
            *(int *)&pLVar3[1].top_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                     _M_impl.super__Vector_impl_data._M_finish = local_e8->elempack;
            pLVar3[1].top_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)local_e8->allocator;
            *(int *)&pLVar3[2]._vptr_Layer = local_e8->dims;
            *(int *)((long)&pLVar3[2]._vptr_Layer + 4) = local_e8->w;
            uVar4 = *(undefined1 *)((long)&local_e8->h + 1);
            uVar5 = *(undefined1 *)((long)&local_e8->h + 2);
            uVar6 = *(undefined1 *)((long)&local_e8->h + 3);
            pLVar3[2].one_blob_only = (bool)*(undefined1 *)&local_e8->h;
            pLVar3[2].support_inplace = (bool)uVar4;
            pLVar3[2].support_vulkan = (bool)uVar5;
            pLVar3[2].support_packing = (bool)uVar6;
            uVar4 = *(undefined1 *)((long)&local_e8->d + 1);
            uVar5 = *(undefined1 *)((long)&local_e8->d + 2);
            uVar6 = *(undefined1 *)((long)&local_e8->d + 3);
            pLVar3[2].support_bf16_storage = (bool)*(undefined1 *)&local_e8->d;
            pLVar3[2].support_fp16_storage = (bool)uVar4;
            pLVar3[2].support_int8_storage = (bool)uVar5;
            pLVar3[2].support_image_storage = (bool)uVar6;
            uVar4 = *(undefined1 *)((long)&local_e8->c + 1);
            uVar5 = *(undefined1 *)((long)&local_e8->c + 2);
            uVar6 = *(undefined1 *)((long)&local_e8->c + 3);
            pLVar3[2].support_tensor_storage = (bool)*(undefined1 *)&local_e8->c;
            pLVar3[2].support_reserved_00 = (bool)uVar4;
            pLVar3[2].support_reserved_0 = (bool)uVar5;
            pLVar3[2].support_reserved_1 = (bool)uVar6;
            uVar4 = *(undefined1 *)((long)&local_e8->cstep + 1);
            uVar5 = *(undefined1 *)((long)&local_e8->cstep + 2);
            uVar6 = *(undefined1 *)((long)&local_e8->cstep + 3);
            uVar7 = *(undefined1 *)((long)&local_e8->cstep + 4);
            uVar8 = *(undefined1 *)((long)&local_e8->cstep + 5);
            uVar9 = *(undefined1 *)((long)&local_e8->cstep + 6);
            uVar10 = *(undefined1 *)((long)&local_e8->cstep + 7);
            pLVar3[2].support_reserved_6 = (bool)*(undefined1 *)&local_e8->cstep;
            pLVar3[2].support_reserved_7 = (bool)uVar4;
            pLVar3[2].support_reserved_8 = (bool)uVar5;
            pLVar3[2].support_reserved_9 = (bool)uVar6;
            pLVar3[2].support_reserved_10 = (bool)uVar7;
            pLVar3[2].support_reserved_11 = (bool)uVar8;
            pLVar3[2].support_reserved_12 = (bool)uVar9;
            pLVar3[2].support_reserved_13 = (bool)uVar10;
          }
          in_stack_fffffffffffffd30 = &local_200;
          local_120 = in_stack_fffffffffffffd30;
          local_d8 = ppMVar19;
          local_28 = in_stack_fffffffffffffd30;
          if (local_200.refcount != (int *)0x0) {
            local_2c = 0xffffffff;
            LOCK();
            local_30 = *local_200.refcount;
            *local_200.refcount = *local_200.refcount + -1;
            UNLOCK();
            if (local_30 == 1) {
              if (local_200.allocator == (Allocator *)0x0) {
                local_20 = local_200.data;
                if (local_200.data != (void *)0x0) {
                  free(local_200.data);
                }
              }
              else {
                (*(local_200.allocator)->_vptr_Allocator[3])(local_200.allocator,local_200.data);
              }
            }
          }
          in_stack_fffffffffffffd30->data = (void *)0x0;
          in_stack_fffffffffffffd30->elemsize = 0;
          in_stack_fffffffffffffd30->elempack = 0;
          in_stack_fffffffffffffd30->dims = 0;
          in_stack_fffffffffffffd30->w = 0;
          in_stack_fffffffffffffd30->h = 0;
          in_stack_fffffffffffffd30->d = 0;
          in_stack_fffffffffffffd30->c = 0;
          in_stack_fffffffffffffd30->cstep = 0;
          in_stack_fffffffffffffd30->refcount = (int *)0x0;
          local_f8 = &local_150[1].bottom_shapes.
                      super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                      super__Vector_impl_data._M_finish;
          local_fc = 0;
          uVar16._0_1_ = local_150[2].support_reserved_6;
          uVar16._1_1_ = local_150[2].support_reserved_7;
          uVar16._2_1_ = local_150[2].support_reserved_8;
          uVar16._3_1_ = local_150[2].support_reserved_9;
          uVar16._4_1_ = local_150[2].support_reserved_10;
          uVar16._5_1_ = local_150[2].support_reserved_11;
          uVar16._6_1_ = local_150[2].support_reserved_12;
          uVar16._7_1_ = local_150[2].support_reserved_13;
          local_100 = (int)uVar16 * *(int *)&local_150[2].support_tensor_storage;
          local_108 = *local_f8;
          for (local_10c = 0; local_8 = local_f8, local_10c < local_100; local_10c = local_10c + 1)
          {
            *(undefined4 *)&local_108->data = 0;
            local_108 = (pointer)((long)&local_108->data + 4);
          }
        }
        iVar12 = *(int *)&local_150[1].one_blob_only / local_15c;
        local_c8 = &local_150[1].name.field_2;
        paVar1 = (allocator_type *)local_c8->_M_allocated_capacity;
        local_d0 = &local_150[1].bottom_shapes.
                    super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        pMVar2 = *local_d0;
        in_stack_fffffffffffffd18 = pMVar2;
        in_stack_fffffffffffffd20 = paVar1;
        for (local_21c = 0; local_21c < local_15c; local_21c = local_21c + 1) {
          iVar21 = iVar12 * local_21c;
          for (local_22c = 0; local_22c < iVar12; local_22c = local_22c + 1) {
            pvVar18 = std::vector<float,_std::allocator<float>_>::operator[]
                                (local_1a8,(long)local_21c);
            *(float *)(paVar1 + (long)local_22c * 4 + (long)iVar21 * 4) =
                 *pvVar18 * *(float *)(paVar1 + (long)local_22c * 4 + (long)iVar21 * 4);
          }
          in_stack_fffffffffffffd10 = *(float *)((long)&pMVar2->data + (long)local_21c * 4);
          pvVar18 = std::vector<float,_std::allocator<float>_>::operator[]
                              (local_1a8,(long)local_21c);
          in_stack_fffffffffffffd14 = *pvVar18;
          pvVar18 = std::vector<float,_std::allocator<float>_>::operator[]
                              (&local_178,(long)local_21c);
          *(float *)((long)&pMVar2->data + (long)local_21c * 4) =
               in_stack_fffffffffffffd10 * in_stack_fffffffffffffd14 + *pvVar18;
        }
        std::vector<float,_std::allocator<float>_>::~vector
                  ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffd20);
        std::vector<float,_std::allocator<float>_>::~vector
                  ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffd20);
        pvVar14 = std::vector<int,_std::allocator<int>_>::operator[](&local_158->tops,0);
        iVar12 = *pvVar14;
        in_stack_fffffffffffffd08 = iVar12;
        pvVar14 = std::vector<int,_std::allocator<int>_>::operator[](&local_150->tops,0);
        *pvVar14 = in_stack_fffffffffffffd08;
        in_stack_fffffffffffffd0c = (int)local_138;
        pvVar20 = std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::operator[]
                            (*(vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> **)(in_RDI + 0x50),
                             (long)iVar12);
        pvVar20->producer = in_stack_fffffffffffffd0c;
        std::__cxx11::string::operator=((string *)&local_158->type,"ncnnfused");
      }
    }
    local_138 = local_138 + 1;
  } while( true );
}

Assistant:

int NetOptimize::fuse_innerproduct_batchnorm()
{
    const size_t layer_count = layers.size();
    for (size_t i = 0; i < layer_count; i++)
    {
        if (layers[i]->type != "InnerProduct")
            continue;

        // InnerProduct - BatchNorm
        int top_blob_index = layers[i]->tops[0];

        size_t j = i + 1;
        for (; j < layer_count; j++)
        {
            if (layers[j]->type != "BatchNorm")
                continue;

            if (layers[j]->bottoms.size() != 1)
                continue;

            if (layers[j]->bottoms[0] == top_blob_index)
                break;
        }

        if (j == layer_count)
            continue;

        // fuse InnerProduct - BatchNorm to InnerProduct
        ncnn::InnerProduct* innerproduct = (ncnn::InnerProduct*)layers[i];
        ncnn::BatchNorm* batchnorm = (ncnn::BatchNorm*)layers[j];

        fprintf(stderr, "fuse_innerproduct_batchnorm %s %s\n", innerproduct->name.c_str(), batchnorm->name.c_str());

        {
            int channels = batchnorm->channels;
            float eps = batchnorm->eps;

            // a = bias - slope * mean / sqrt(var + eps)
            // b = slope / sqrt(var + eps)
            // value = value * b + a

            std::vector<float> a(channels);
            std::vector<float> b(channels);
            for (int i = 0; i < channels; i++)
            {
                float sqrt_var = static_cast<float>(sqrt(batchnorm->var_data[i] + eps));
                a[i] = batchnorm->bias_data[i] - batchnorm->slope_data[i] * batchnorm->mean_data[i] / sqrt_var;
                b[i] = batchnorm->slope_data[i] / sqrt_var;
            }

            if (innerproduct->bias_term == 0)
            {
                // init bias as zero
                innerproduct->bias_term = 1;
                innerproduct->bias_data = ncnn::Mat(channels);
                innerproduct->bias_data.fill(0.f);
            }

            const int weight_per_outch = innerproduct->weight_data_size / channels;

            float* weight = innerproduct->weight_data;
            float* bias = innerproduct->bias_data;
            for (int i = 0; i < channels; i++)
            {
                float* conv_weight_outch = weight + weight_per_outch * i;
                for (int j = 0; j < weight_per_outch; j++)
                {
                    conv_weight_outch[j] *= b[i];
                }

                bias[i] = bias[i] * b[i] + a[i];
            }
        }

        int top_blob_index_final = batchnorm->tops[0];
        innerproduct->tops[0] = top_blob_index_final;
        blobs[top_blob_index_final].producer = i;
        batchnorm->type = "ncnnfused";
    }

    return 0;
}